

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModel.cpp
# Opt level: O0

EnumeratorDeclarationSymbol * __thiscall
psy::C::SemanticModel::enumeratorFor(SemanticModel *this,EnumeratorDeclarationSyntax *node)

{
  bool bVar1;
  SymbolKind SVar2;
  int iVar3;
  pointer pSVar4;
  pointer ppVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  undefined4 extraout_var_00;
  DeclarationSymbol *decl;
  _Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
  local_28;
  iterator it;
  EnumeratorDeclarationSyntax *node_local;
  SemanticModel *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
             )(_Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
               )node;
  pSVar4 = std::
           unique_ptr<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
           ::operator->(&this->impl_);
  local_30 = it.
             super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
             ._M_cur;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_psy::C::SyntaxNode_*,_psy::C::DeclarationSymbol_*,_std::hash<const_psy::C::SyntaxNode_*>,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>_>_>
       ::find(&pSVar4->declsBySyntax_,(key_type *)&local_30);
  pSVar4 = std::
           unique_ptr<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
           ::operator->(&this->impl_);
  decl = (DeclarationSymbol *)
         std::
         unordered_map<const_psy::C::SyntaxNode_*,_psy::C::DeclarationSymbol_*,_std::hash<const_psy::C::SyntaxNode_*>,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>_>_>
         ::end(&pSVar4->declsBySyntax_);
  bVar1 = std::__detail::operator==
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
                      *)&decl);
  if (bVar1) {
    pSVar4 = std::
             unique_ptr<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
             ::operator->(&this->impl_);
    if ((pSVar4->bindingIsOK_ & 1U) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe9);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::operator<<(poVar6,"<empty message>");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    this_local = (SemanticModel *)0x0;
  }
  else {
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false,_false>
                           *)&local_28);
    iVar3 = (*(ppVar5->second->super_Symbol)._vptr_Symbol[6])();
    SVar2 = Symbol::kind((Symbol *)CONCAT44(extraout_var,iVar3));
    if (SVar2 == EnumeratorDeclaration) {
      iVar3 = (*((Symbol *)CONCAT44(extraout_var,iVar3))->_vptr_Symbol[0x12])();
      this_local = (SemanticModel *)CONCAT44(extraout_var_00,iVar3);
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xed);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::operator<<(poVar6,"<empty message>");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      this_local = (SemanticModel *)0x0;
    }
  }
  return (EnumeratorDeclarationSymbol *)this_local;
}

Assistant:

EnumeratorDeclarationSymbol* SemanticModel::enumeratorFor(
        const EnumeratorDeclarationSyntax* node)
{
    auto it = P->declsBySyntax_.find(node);
    if (it == P->declsBySyntax_.end()) {
        PSY_ASSERT_1(!P->bindingIsOK_);
        return nullptr;
    }
    auto decl = it->second->asDeclaration();
    PSY_ASSERT_2(decl->kind() == SymbolKind::EnumeratorDeclaration, return nullptr);
    return decl->asEnumeratorDeclaration();
}